

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolMACEthernet.cpp
# Opt level: O0

void __thiscall
ProtocolMACEthernet::Transmit
          (ProtocolMACEthernet *this,DataBuffer *buffer,uint8_t *targetMAC,uint16_t type)

{
  ushort uVar1;
  size_t sVar2;
  size_t offset;
  uint16_t type_local;
  uint8_t *targetMAC_local;
  DataBuffer *buffer_local;
  ProtocolMACEthernet *this_local;
  
  sVar2 = header_size();
  buffer->Packet = buffer->Packet + -sVar2;
  sVar2 = header_size();
  buffer->Length = buffer->Length + (short)sVar2;
  sVar2 = PackBytes(buffer->Packet,0,targetMAC,6);
  sVar2 = PackBytes(buffer->Packet,sVar2,this->UnicastAddress,6);
  Pack16(buffer->Packet,sVar2,type);
  while (buffer->Length < 0x3c) {
    uVar1 = buffer->Length;
    buffer->Length = uVar1 + 1;
    buffer->Packet[uVar1] = '\0';
  }
  if (this->TxHandler != (DataTransmitHandler)0x0) {
    (*this->TxHandler)(buffer->Packet,(size_t)buffer->Length);
  }
  if ((buffer->Disposable & 1U) != 0) {
    osQueue::Put(&this->TxBufferQueue,buffer);
  }
  return;
}

Assistant:

void ProtocolMACEthernet::Transmit(DataBuffer* buffer, const uint8_t* targetMAC, uint16_t type)
{
    buffer->Packet -= header_size();
    buffer->Length += header_size();

    size_t offset = 0;
    offset = PackBytes(buffer->Packet, offset, targetMAC, 6);
    offset = PackBytes(buffer->Packet, offset, UnicastAddress, 6);
    offset = Pack16(buffer->Packet, offset, type);

    offset += buffer->Length;
    while (buffer->Length < 60)
    {
        buffer->Packet[buffer->Length++] = 0;
    }

    if (TxHandler)
    {
        TxHandler(buffer->Packet, buffer->Length);
    }

    if (buffer->Disposable)
    {
        TxBufferQueue.Put(buffer);
    }
}